

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O2

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_Stream,QPDFObjectHandle,unsigned_long&>
          (QPDFObject *this,QPDF *qpdf,QPDFObjGen og,QPDFObjectHandle *args,unsigned_long *args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_> local_40;
  QPDFObjGen local_38;
  QPDFObjGen local_30;
  QPDFObjectHandle local_28;
  
  local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (args->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (args->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38 = (QPDFObjGen)qpdf;
  local_30 = og;
  QPDF_Stream::QPDF_Stream((QPDF_Stream *)&local_40,&local_28,*args_1);
  std::make_shared<QPDFObject,QPDF*&,QPDFObjGen&,QPDF_Stream>
            ((QPDF **)this,&local_38,(QPDF_Stream *)&local_30);
  std::unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>::~unique_ptr
            (&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static std::shared_ptr<QPDFObject>
    create(QPDF* qpdf, QPDFObjGen og, Args&&... args)
    {
        return std::make_shared<QPDFObject>(
            qpdf, og, std::forward<T>(T(std::forward<Args>(args)...)));
    }